

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_cond_swap(mp_int *x0,mp_int *x1,uint swap)

{
  ulong uVar1;
  BignumInt diff;
  size_t i;
  BignumInt mask;
  uint swap_local;
  mp_int *x1_local;
  mp_int *x0_local;
  
  if (x0->nw == x1->nw) {
    for (diff = 0; diff < x0->nw; diff = diff + 1) {
      uVar1 = (x0->w[diff] ^ x1->w[diff]) & -(ulong)(swap & 1);
      x0->w[diff] = uVar1 ^ x0->w[diff];
      x1->w[diff] = uVar1 ^ x1->w[diff];
    }
    return;
  }
  __assert_fail("x0->nw == x1->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0xa6,"void mp_cond_swap(mp_int *, mp_int *, unsigned int)");
}

Assistant:

void mp_cond_swap(mp_int *x0, mp_int *x1, unsigned swap)
{
    assert(x0->nw == x1->nw);
    volatile BignumInt mask = -(BignumInt)(1 & swap);
    for (size_t i = 0; i < x0->nw; i++) {
        BignumInt diff = (x0->w[i] ^ x1->w[i]) & mask;
        x0->w[i] ^= diff;
        x1->w[i] ^= diff;
    }
}